

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double dirichlet_mix_pdf(double *x,int comp_num,int elem_num,double *a,double *comp_weight)

{
  double *a_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double local_40;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < elem_num) {
    uVar3 = (ulong)(uint)elem_num << 3;
  }
  a_00 = (double *)operator_new__(uVar3);
  uVar1 = 0;
  uVar3 = (ulong)(uint)comp_num;
  if (comp_num < 1) {
    uVar3 = uVar1;
  }
  dVar6 = 0.0;
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    dVar6 = dVar6 + comp_weight[uVar1];
  }
  uVar4 = 0;
  uVar1 = 0;
  if (0 < elem_num) {
    uVar1 = (ulong)(uint)elem_num;
  }
  local_40 = 0.0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      a_00[uVar2] = a[uVar2];
    }
    dVar5 = dirichlet_pdf(x,elem_num,a_00);
    local_40 = local_40 + (dVar5 * comp_weight[uVar4]) / dVar6;
    a = a + elem_num;
  }
  operator_delete__(a_00);
  return local_40;
}

Assistant:

double dirichlet_mix_pdf ( double x[], int comp_num, int elem_num, double a[],
  double comp_weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_PDF evaluates a Dirichlet mixture PDF.
//
//  Discussion:
//
//    The PDF is a weighted sum of Dirichlet PDF's.  Each PDF is a
//    "component", with an associated weight.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X[ELEM_NUM], the argument of the PDF.
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities for
//    element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Output, double DIRICHLET_MIX_PDF, the value of the PDF.
//
{
  double *a_vec;
  double comp_pdf;
  double comp_weight_sum;
  int i;
  int j;
  double pdf;

  a_vec = new double[elem_num];

  comp_weight_sum = 0.0;
  for ( j = 0; j < comp_num; j++ )
  {
    comp_weight_sum = comp_weight_sum + comp_weight[j];
  }

  pdf = 0.0;
  for ( j = 0; j < comp_num; j++ )
  {
    for ( i = 0; i < elem_num; i++ )
    {
      a_vec[i] = a[i+j*elem_num];
    }
    comp_pdf = dirichlet_pdf ( x, elem_num, a_vec );

    pdf = pdf + comp_weight[j] * comp_pdf / comp_weight_sum;
  }

  delete [] a_vec;

  return pdf;
}